

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManTransferPacking(Gia_Man_t *p,Gia_Man_t *pGia)

{
  int Entry;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int iVar3;
  int i;
  bool bVar4;
  
  if (pGia->vPacking != (Vec_Int_t *)0x0) {
    iVar3 = 0;
    Entry = Vec_IntEntry(pGia->vPacking,0);
    p_00 = Vec_IntAlloc(pGia->vPacking->nSize);
    Vec_IntPush(p_00,Entry);
    i = 1;
    while (i < pGia->vPacking->nSize) {
      iVar1 = Vec_IntEntry(pGia->vPacking,i);
      iVar2 = iVar1;
      if (2 < iVar1 - 1U) {
        __assert_fail("Entry > 0 && Entry < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                      ,0x850,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
      }
      while( true ) {
        Vec_IntPush(p_00,iVar2);
        i = i + 1;
        bVar4 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar4) break;
        iVar2 = Vec_IntEntry(pGia->vPacking,i);
        pObj = Gia_ManObj(pGia,iVar2);
        iVar2 = Abc_Lit2Var(pObj->Value);
        pObj_00 = Gia_ManObj(p,iVar2);
        iVar2 = Gia_ObjId(pGia,pObj);
        iVar2 = Gia_ObjIsLut(pGia,iVar2);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x857,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
        }
        iVar2 = Gia_ObjId(p,pObj_00);
        iVar2 = Gia_ObjIsLut(p,iVar2);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x858,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
        }
        iVar2 = Gia_ObjId(p,pObj_00);
      }
      iVar3 = iVar3 + 1;
    }
    if (Entry != iVar3) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x85f,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    if (p->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("p->vPacking == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x861,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    p->vPacking = p_00;
  }
  return;
}

Assistant:

void Gia_ManTransferPacking( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Vec_Int_t * vPackingNew;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, Entry, nEntries, nEntries2;
    if ( pGia->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( pGia->vPacking, 0 );
    nEntries2 = 0;
    // create new packing info
    vPackingNew = Vec_IntAlloc( Vec_IntSize(pGia->vPacking) );
    Vec_IntPush( vPackingNew, nEntries );
    Vec_IntForEachEntryStart( pGia->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        Vec_IntPush( vPackingNew, Entry );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
        {
            pObj = Gia_ManObj(pGia, Vec_IntEntry(pGia->vPacking, i));
            pObjNew = Gia_ManObj(p, Abc_Lit2Var(Gia_ObjValue(pObj)));
            assert( Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj)) );
            assert( Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew)) );
            Vec_IntPush( vPackingNew, Gia_ObjId(p, pObjNew) );
//            printf( "%d -> %d  ", Vec_IntEntry(pGia->vPacking, i), Gia_ObjId(p, pObjNew) );
        }
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    // attach packing info
    assert( p->vPacking == NULL );
    p->vPacking = vPackingNew;
}